

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int incrVacuumStep(BtShared *pBt,Pgno nFin,Pgno iLastPg,int bCommit)

{
  Pgno PVar1;
  uint uVar2;
  u32 uVar3;
  int iVar4;
  u8 eType;
  MemPage *pFreePg;
  uint local_4c;
  uint local_48;
  u32 local_44;
  Pgno iFreePg_1;
  Pgno iPtrPage;
  Pgno iFreePg;
  
  PVar1 = ptrmapPageno(pBt,iLastPg);
  if ((PVar1 != iLastPg) && ((uint)sqlite3PendingByte / pBt->pageSize + 1 != iLastPg)) {
    uVar3 = sqlite3Get4byte(pBt->pPage1->aData + 0x24);
    if (uVar3 == 0) {
      return 0x65;
    }
    iVar4 = ptrmapGet(pBt,iLastPg,&eType,&iPtrPage);
    if (iVar4 != 0) {
      return iVar4;
    }
    if (eType == '\x02') {
      if (bCommit == 0) {
        iVar4 = allocateBtreePage(pBt,&pFreePg,&iFreePg,iLastPg,'\x01');
        if (iVar4 != 0) {
          return iVar4;
        }
        releasePage(pFreePg);
      }
    }
    else {
      if (eType == '\x01') {
        iVar4 = 0x1191e;
LAB_00162033:
        iVar4 = sqlite3CorruptError(iVar4);
        return iVar4;
      }
      iVar4 = btreeGetPage(pBt,iLastPg,&pFreePg,0);
      if (iVar4 != 0) {
        return iVar4;
      }
      local_4c = (uint)eType;
      PVar1 = 0;
      if (bCommit == 0) {
        PVar1 = nFin;
      }
      local_48 = (uint)(byte)((bCommit == 0) * '\x02');
      do {
        local_44 = pBt->nPage;
        iVar4 = allocateBtreePage(pBt,(MemPage **)&iFreePg,&iFreePg_1,PVar1,(u8)local_48);
        if (iVar4 != 0) {
          releasePage(pFreePg);
          return iVar4;
        }
        releasePage(_iFreePg);
        if (local_44 < iFreePg_1) {
          releasePage(pFreePg);
          iVar4 = 0x11952;
          goto LAB_00162033;
        }
      } while ((bCommit != 0) && (nFin < iFreePg_1));
      iVar4 = relocatePage(pBt,pFreePg,(u8)local_4c,iPtrPage,iFreePg_1,bCommit);
      releasePage(pFreePg);
      if (iVar4 != 0) {
        return iVar4;
      }
    }
  }
  if (bCommit == 0) {
    uVar2 = (uint)sqlite3PendingByte / pBt->pageSize;
    do {
      do {
        iLastPg = iLastPg - 1;
      } while ((-2 - uVar2) + iLastPg == -1);
      PVar1 = ptrmapPageno(pBt,iLastPg);
    } while (iLastPg == PVar1);
    pBt->bDoTruncate = '\x01';
    pBt->nPage = iLastPg;
  }
  return 0;
}

Assistant:

static int incrVacuumStep(BtShared *pBt, Pgno nFin, Pgno iLastPg, int bCommit){
  Pgno nFreeList;           /* Number of pages still on the free-list */
  int rc;

  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( iLastPg>nFin );

  if( !PTRMAP_ISPAGE(pBt, iLastPg) && iLastPg!=PENDING_BYTE_PAGE(pBt) ){
    u8 eType;
    Pgno iPtrPage;

    nFreeList = get4byte(&pBt->pPage1->aData[36]);
    if( nFreeList==0 ){
      return SQLITE_DONE;
    }

    rc = ptrmapGet(pBt, iLastPg, &eType, &iPtrPage);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    if( eType==PTRMAP_ROOTPAGE ){
      return SQLITE_CORRUPT_BKPT;
    }

    if( eType==PTRMAP_FREEPAGE ){
      if( bCommit==0 ){
        /* Remove the page from the files free-list. This is not required
        ** if bCommit is non-zero. In that case, the free-list will be
        ** truncated to zero after this function returns, so it doesn't
        ** matter if it still contains some garbage entries.
        */
        Pgno iFreePg;
        MemPage *pFreePg;
        rc = allocateBtreePage(pBt, &pFreePg, &iFreePg, iLastPg, BTALLOC_EXACT);
        if( rc!=SQLITE_OK ){
          return rc;
        }
        assert( iFreePg==iLastPg );
        releasePage(pFreePg);
      }
    } else {
      Pgno iFreePg;             /* Index of free page to move pLastPg to */
      MemPage *pLastPg;
      u8 eMode = BTALLOC_ANY;   /* Mode parameter for allocateBtreePage() */
      Pgno iNear = 0;           /* nearby parameter for allocateBtreePage() */

      rc = btreeGetPage(pBt, iLastPg, &pLastPg, 0);
      if( rc!=SQLITE_OK ){
        return rc;
      }

      /* If bCommit is zero, this loop runs exactly once and page pLastPg
      ** is swapped with the first free page pulled off the free list.
      **
      ** On the other hand, if bCommit is greater than zero, then keep
      ** looping until a free-page located within the first nFin pages
      ** of the file is found.
      */
      if( bCommit==0 ){
        eMode = BTALLOC_LE;
        iNear = nFin;
      }
      do {
        MemPage *pFreePg;
        Pgno dbSize = btreePagecount(pBt);
        rc = allocateBtreePage(pBt, &pFreePg, &iFreePg, iNear, eMode);
        if( rc!=SQLITE_OK ){
          releasePage(pLastPg);
          return rc;
        }
        releasePage(pFreePg);
        if( iFreePg>dbSize ){
          releasePage(pLastPg);
          return SQLITE_CORRUPT_BKPT;
        }
      }while( bCommit && iFreePg>nFin );
      assert( iFreePg<iLastPg );

      rc = relocatePage(pBt, pLastPg, eType, iPtrPage, iFreePg, bCommit);
      releasePage(pLastPg);
      if( rc!=SQLITE_OK ){
        return rc;
      }
    }
  }

  if( bCommit==0 ){
    do {
      iLastPg--;
    }while( iLastPg==PENDING_BYTE_PAGE(pBt) || PTRMAP_ISPAGE(pBt, iLastPg) );
    pBt->bDoTruncate = 1;
    pBt->nPage = iLastPg;
  }
  return SQLITE_OK;
}